

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::ThreadedSocketInitiator
          (ThreadedSocketInitiator *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings,LogFactory *logFactory)

{
  LogFactory *logFactory_local;
  SessionSettings *settings_local;
  MessageStoreFactory *factory_local;
  Application *application_local;
  ThreadedSocketInitiator *this_local;
  
  Initiator::Initiator(&this->super_Initiator,application,factory,settings,logFactory);
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__ThreadedSocketInitiator_0030d710;
  SessionSettings::SessionSettings(&this->m_settings);
  std::
  map<FIX::SessionID,_int,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::map(&this->m_sessionToHostNum);
  this->m_lastConnect = 0;
  this->m_reconnectInterval = 0x1e;
  this->m_noDelay = false;
  this->m_sendBufSize = 0;
  this->m_rcvBufSize = 0;
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map(&this->m_threads);
  Mutex::Mutex(&this->m_mutex);
  socket_init();
  return;
}

Assistant:

ThreadedSocketInitiator::ThreadedSocketInitiator(
  Application& application,
  MessageStoreFactory& factory,
  const SessionSettings& settings,
  LogFactory& logFactory ) EXCEPT ( ConfigError )
: Initiator( application, factory, settings, logFactory ),
  m_lastConnect( 0 ), m_reconnectInterval( 30 ), m_noDelay( false ),
  m_sendBufSize( 0 ), m_rcvBufSize( 0 )
{
  socket_init();
}